

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

DataVariable __thiscall Rml::DataModel::GetVariable(DataModel *this,DataAddress *address)

{
  DataVariable *pDVar1;
  pointer pDVar2;
  bool bVar3;
  VariableDefinition *pVVar4;
  long lVar5;
  long lVar6;
  const_iterator cVar7;
  DataVariable DVar8;
  undefined1 auVar9 [16];
  DataVariable local_48;
  undefined1 auVar10 [16];
  
  pDVar2 = (address->
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pDVar2 != (address->
                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    cVar7 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->variables,&pDVar2->name);
    if (cVar7.mKeyVals == (NodePtr)(this->variables).mInfo) {
      bVar3 = ::std::operator==(&((address->
                                  super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->name,"literal");
      if (((bVar3) &&
          (pDVar2 = (address->
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          2 < (ulong)(((long)(address->
                             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x28)))
         && (bVar3 = ::std::operator==(&pDVar2[1].name,"int"), bVar3)) {
        DVar8 = MakeLiteralIntVariable
                          ((address->
                           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start[2].index);
        auVar9._0_8_ = DVar8.definition;
        auVar9._8_8_ = DVar8.ptr;
        return (DataVariable)auVar9;
      }
    }
    else {
      pDVar1 = &((cVar7.mKeyVals)->mData).second;
      pVVar4 = pDVar1->definition;
      local_48 = *pDVar1;
      lVar6 = 1;
      lVar5 = 0x28;
      do {
        pDVar2 = (address->
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (((int)(((long)(address->
                          super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x28) <=
             lVar6) || (pVVar4 == (VariableDefinition *)0x0)) {
          auVar10._0_8_ = pVVar4;
          auVar10._8_8_ = local_48.ptr;
          return (DataVariable)auVar10;
        }
        local_48 = DataVariable::Child(&local_48,
                                       (DataAddressEntry *)
                                       ((long)&(pDVar2->name)._M_dataplus._M_p + lVar5));
        pVVar4 = local_48.definition;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x28;
      } while (pVVar4 != (VariableDefinition *)0x0);
    }
  }
  return (DataVariable)ZEXT816(0);
}

Assistant:

DataVariable DataModel::GetVariable(const DataAddress& address) const
{
	if (address.empty())
		return DataVariable();

	auto it = variables.find(address.front().name);
	if (it != variables.end())
	{
		DataVariable variable = it->second;

		for (int i = 1; i < (int)address.size() && variable; i++)
		{
			variable = variable.Child(address[i]);
			if (!variable)
				return DataVariable();
		}

		return variable;
	}

	if (address[0].name == "literal")
	{
		if (address.size() > 2 && address[1].name == "int")
			return MakeLiteralIntVariable(address[2].index);
	}

	return DataVariable();
}